

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buf_slot.cpp
# Opt level: O0

size_t mpp_buf_slot_get_size(MppBufSlots slots)

{
  undefined1 local_30 [8];
  AutoMutex auto_lock;
  MppBufSlotsImpl *impl;
  MppBufSlots slots_local;
  
  if (slots == (MppBufSlots)0x0) {
    _mpp_log_l(2,"mpp_buf_slot","found NULL input\n","mpp_buf_slot_get_size");
    slots_local = (MppBufSlots)0x0;
  }
  else {
    auto_lock.mLock = (Mutex *)slots;
    Mutex::Autolock::Autolock((Autolock *)local_30,*slots,1);
    slots_local = *(MppBufSlots *)((long)&auto_lock.mLock[2].mMutex + 8);
    Mutex::Autolock::~Autolock((Autolock *)local_30);
  }
  return (size_t)slots_local;
}

Assistant:

size_t mpp_buf_slot_get_size(MppBufSlots slots)
{
    if (NULL == slots) {
        mpp_err_f("found NULL input\n");
        return 0;
    }

    MppBufSlotsImpl *impl = (MppBufSlotsImpl *)slots;
    AutoMutex auto_lock(impl->lock);
    return impl->buf_size;
}